

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic.t.cpp
# Opt level: O0

void f(int n)

{
  atomic_flag aVar1;
  ostream *poVar2;
  int local_2c;
  int cnt;
  int n_local;
  memory_order __b;
  
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    do {
      aVar1.super___atomic_flag_base._M_i = lock.super___atomic_flag_base._M_i;
      LOCK();
      lock.super___atomic_flag_base._M_i = (__atomic_flag_base)true;
      UNLOCK();
    } while (aVar1.super___atomic_flag_base._M_i != false);
    poVar2 = std::operator<<((ostream *)&std::cout,"Output from thread ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    std::operator<<(poVar2,'\n');
    std::operator&(memory_order_release,__memory_order_mask);
    lock.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  }
  return;
}

Assistant:

void f( int n )
{
	for (int cnt = 0; cnt < 4; ++cnt)
	{
		// acquire lock:
		while ( lock.test_and_set(nonstd::memory_order_acquire) )
		{
			// spin read: only until a cmpxchg might succeed:
//			while( *p )
				_mm_pause();
		}

		std::cout << "Output from thread " << n << '\n';

		// release lock:
		lock.clear(nonstd::memory_order_release);
	}
}